

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void fmt::v10::detail::format_dragon
               (basic_fp<unsigned___int128> value,uint flags,int num_digits,buffer<char> *buf,
               int *exp10)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint *puVar4;
  char *pcVar5;
  undefined1 n [16];
  undefined1 n_00 [16];
  undefined1 value_00 [16];
  uint uVar6;
  int iVar7;
  bigint *lhs2;
  size_t sVar8;
  runtime_error *this;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  bigint numerator;
  bigint denominator;
  bigint lower;
  bigint upper_store;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  bigint *this_00;
  bigint *pbVar16;
  undefined4 uVar17;
  undefined4 in_stack_fffffffffffffcc4;
  undefined4 uVar18;
  bigint local_2f0;
  bigint local_240;
  bigint local_190;
  bigint local_e0;
  
  local_2f0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_2f0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0013aa58;
  puVar1 = local_2f0.bigits_.store_;
  local_2f0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_2f0.exp_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_240.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0013aa58;
  puVar2 = local_240.bigits_.store_;
  local_240.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_240.exp_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_190.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0013aa58;
  puVar3 = local_190.bigits_.store_;
  local_190.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_190.exp_ = 0;
  this_00 = &local_e0;
  local_e0.bigits_.super_buffer<unsigned_int>.size_ = 0;
  local_e0.bigits_.super_buffer<unsigned_int>._vptr_buffer = (_func_int **)&PTR_grow_0013aa58;
  puVar4 = local_e0.bigits_.store_;
  local_e0.bigits_.super_buffer<unsigned_int>.capacity_ = 0x20;
  local_e0.exp_ = 0;
  iVar11 = (flags & 1) + 1;
  local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar1;
  local_240.bigits_.super_buffer<unsigned_int>.ptr_ = puVar2;
  local_190.bigits_.super_buffer<unsigned_int>.ptr_ = puVar3;
  local_e0.bigits_.super_buffer<unsigned_int>.ptr_ = puVar4;
  if (value.e < 0) {
    if (*exp10 < 0) {
      bigint::assign_pow10(&local_2f0,-*exp10);
      bigint::assign(&local_190,&local_2f0);
      if ((flags & 1) == 0) {
        this_00 = (bigint *)0x0;
      }
      else {
        this_00 = &local_e0;
        bigint::assign(this_00,&local_2f0);
        bigint::operator<<=(&local_e0,1);
      }
      value_00._8_4_ = flags;
      value_00._0_8_ = this_00;
      value_00._12_4_ = in_stack_fffffffffffffcc4;
      bigint::operator*=(&local_2f0,(unsigned___int128)value_00);
      bigint::operator<<=(&local_2f0,iVar11);
      bigint::assign<unsigned_long,_0>(&local_240,1);
      bigint::operator<<=(&local_240,iVar11 - value.e);
    }
    else {
      n_00._8_4_ = flags;
      n_00._0_8_ = this_00;
      n_00._12_4_ = in_stack_fffffffffffffcc4;
      bigint::operator=(&local_2f0,(unsigned___int128)n_00);
      bigint::operator<<=(&local_2f0,iVar11);
      bigint::assign_pow10(&local_240,*exp10);
      bigint::operator<<=(&local_240,iVar11 - value.e);
      bigint::assign<unsigned_long,_0>(&local_190,1);
      if ((flags & 1) == 0) {
        this_00 = (bigint *)0x0;
      }
      else {
        bigint::assign<unsigned_long,_0>(&local_e0,2);
      }
    }
  }
  else {
    n._4_4_ = in_stack_fffffffffffffcbc;
    n._0_4_ = in_stack_fffffffffffffcb8;
    n._8_4_ = flags;
    n._12_4_ = in_stack_fffffffffffffcc4;
    bigint::operator=(&local_2f0,(unsigned___int128)n);
    bigint::operator<<=(&local_2f0,value.e + iVar11);
    bigint::assign<unsigned_long,_0>(&local_190,1);
    bigint::operator<<=(&local_190,value.e);
    if ((flags & 1) == 0) {
      this_00 = (bigint *)0x0;
    }
    else {
      this_00 = &local_e0;
      bigint::assign<unsigned_long,_0>(this_00,1);
      bigint::operator<<=(&local_e0,value.e + 1);
    }
    bigint::assign_pow10(&local_240,*exp10);
    bigint::operator<<=(&local_240,iVar11);
  }
  uVar9 = ~(uint)value.f & 1;
  lhs2 = &local_190;
  if (this_00 != (bigint *)0x0) {
    lhs2 = this_00;
  }
  uVar13 = num_digits;
  if ((flags & 2) != 0) {
    pbVar16 = this_00;
    iVar11 = add_compare(&local_2f0,lhs2,&local_240);
    if (iVar11 + uVar9 == 0 || SCARRY4(iVar11,uVar9) != (int)(iVar11 + uVar9) < 0) {
      *exp10 = *exp10 + -1;
      bigint::multiply(&local_2f0,10);
      if (num_digits < 0) {
        bigint::multiply(&local_190,10);
        if (this_00 != (bigint *)0x0) {
          bigint::multiply(this_00,10);
        }
      }
    }
    this_00 = pbVar16;
    if ((flags & 4) != 0) {
      iVar11 = *exp10;
      if (0x7ffffffe - iVar11 < num_digits && -1 < iVar11) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"number is too big");
        *(undefined ***)this = &PTR__runtime_error_0013a8d0;
        __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar13 = num_digits + iVar11 + 1;
    }
  }
  if (-1 < num_digits) {
    uVar9 = uVar13 - 1;
    *exp10 = *exp10 - uVar9;
    if ((int)uVar13 < 1) {
      bigint::multiply(&local_240,10);
      iVar11 = add_compare(&local_2f0,&local_2f0,&local_240);
      sVar8 = buf->size_;
      uVar12 = sVar8 + 1;
      if (buf->capacity_ < uVar12) {
        (**buf->_vptr_buffer)(buf);
        sVar8 = buf->size_;
        uVar12 = sVar8 + 1;
      }
      buf->size_ = uVar12;
      buf->ptr_[sVar8] = 0 < iVar11 | 0x30;
    }
    else {
      uVar10 = (ulong)uVar13;
      uVar12 = buf->capacity_;
      if (uVar12 < uVar10) {
        (**buf->_vptr_buffer)(buf,uVar10);
        uVar12 = buf->capacity_;
      }
      if (uVar10 <= uVar12) {
        uVar12 = uVar10;
      }
      buf->size_ = uVar12;
      if (uVar13 != 1) {
        uVar14 = (ulong)uVar9;
        uVar12 = 0;
        do {
          iVar11 = bigint::divmod_assign(&local_2f0,&local_240);
          buf->ptr_[uVar12] = (char)iVar11 + '0';
          bigint::multiply(&local_2f0,10);
          uVar12 = uVar12 + 1;
        } while (uVar14 != uVar12);
      }
      uVar6 = bigint::divmod_assign(&local_2f0,&local_240);
      iVar11 = add_compare(&local_2f0,&local_2f0,&local_240);
      if ((0 < iVar11) || ((uVar6 & 1) != 0 && iVar11 == 0)) {
        if (uVar6 == 9) {
          buf->ptr_[(int)uVar9] = ':';
          if (uVar13 != 1) {
            iVar11 = uVar13 + 1;
            do {
              uVar12 = uVar10 - 1 & 0xffffffff;
              if (buf->ptr_[uVar12] != ':') break;
              buf->ptr_[uVar12] = '0';
              buf->ptr_[uVar10 - 2] = buf->ptr_[uVar10 - 2] + '\x01';
              iVar11 = iVar11 + -1;
              uVar10 = uVar10 - 1;
            } while (2 < iVar11);
          }
          if (*buf->ptr_ == ':') {
            *buf->ptr_ = '1';
            if ((flags & 4) == 0) {
              *exp10 = *exp10 + 1;
            }
            else {
              sVar8 = buf->size_;
              uVar12 = sVar8 + 1;
              if (buf->capacity_ < uVar12) {
                (**buf->_vptr_buffer)(buf);
                sVar8 = buf->size_;
                uVar12 = sVar8 + 1;
              }
              buf->size_ = uVar12;
              buf->ptr_[sVar8] = '0';
            }
          }
          goto LAB_00114a16;
        }
        uVar6 = uVar6 + 1;
      }
      buf->ptr_[(int)uVar9] = (char)uVar6 + '0';
    }
    goto LAB_00114a16;
  }
  uVar17 = SUB84(buf->ptr_,0);
  uVar18 = (undefined4)((ulong)buf->ptr_ >> 0x20);
  lVar15 = 0;
  while( true ) {
    uVar13 = bigint::divmod_assign(&local_2f0,&local_240);
    iVar11 = compare(&local_2f0,&local_190);
    iVar7 = add_compare(&local_2f0,lhs2,&local_240);
    *(char *)(CONCAT44(uVar18,uVar17) + lVar15) = (char)uVar13 + '0';
    if ((iVar11 < (int)uVar9) || ((int)-uVar9 < iVar7)) break;
    bigint::multiply(&local_2f0,10);
    bigint::multiply(&local_190,10);
    if (this_00 != (bigint *)0x0) {
      bigint::multiply(this_00,10);
    }
    lVar15 = lVar15 + 1;
  }
  if (iVar11 < (int)uVar9) {
    if ((int)-uVar9 < iVar7) {
      iVar11 = add_compare(&local_2f0,&local_2f0,&local_240);
      if ((0 < iVar11) || ((uVar13 & 1) != 0 && iVar11 == 0)) goto LAB_00114963;
    }
  }
  else {
LAB_00114963:
    pcVar5 = (char *)(CONCAT44(uVar18,uVar17) + -1 + (lVar15 + 1U & 0xffffffff));
    *pcVar5 = *pcVar5 + '\x01';
  }
  uVar10 = lVar15 + 1U & 0xffffffff;
  uVar12 = buf->capacity_;
  if (uVar12 < uVar10) {
    (**buf->_vptr_buffer)(buf,uVar10);
    uVar12 = buf->capacity_;
  }
  if (uVar12 < uVar10) {
    uVar10 = uVar12;
  }
  buf->size_ = uVar10;
  *exp10 = *exp10 - (int)lVar15;
LAB_00114a16:
  if (local_e0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar4) {
    operator_delete(local_e0.bigits_.super_buffer<unsigned_int>.ptr_);
  }
  if (local_190.bigits_.super_buffer<unsigned_int>.ptr_ != puVar3) {
    operator_delete(local_190.bigits_.super_buffer<unsigned_int>.ptr_);
  }
  if (local_240.bigits_.super_buffer<unsigned_int>.ptr_ != puVar2) {
    operator_delete(local_240.bigits_.super_buffer<unsigned_int>.ptr_);
  }
  if (local_2f0.bigits_.super_buffer<unsigned_int>.ptr_ != puVar1) {
    operator_delete(local_2f0.bigits_.super_buffer<unsigned_int>.ptr_);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 inline void format_dragon(basic_fp<uint128_t> value,
                                          unsigned flags, int num_digits,
                                          buffer<char>& buf, int& exp10) {
  bigint numerator;    // 2 * R in (FPP)^2.
  bigint denominator;  // 2 * S in (FPP)^2.
  // lower and upper are differences between value and corresponding boundaries.
  bigint lower;             // (M^- in (FPP)^2).
  bigint upper_store;       // upper's value if different from lower.
  bigint* upper = nullptr;  // (M^+ in (FPP)^2).
  // Shift numerator and denominator by an extra bit or two (if lower boundary
  // is closer) to make lower and upper integers. This eliminates multiplication
  // by 2 during later computations.
  bool is_predecessor_closer = (flags & dragon::predecessor_closer) != 0;
  int shift = is_predecessor_closer ? 2 : 1;
  if (value.e >= 0) {
    numerator = value.f;
    numerator <<= value.e + shift;
    lower = 1;
    lower <<= value.e;
    if (is_predecessor_closer) {
      upper_store = 1;
      upper_store <<= value.e + 1;
      upper = &upper_store;
    }
    denominator.assign_pow10(exp10);
    denominator <<= shift;
  } else if (exp10 < 0) {
    numerator.assign_pow10(-exp10);
    lower.assign(numerator);
    if (is_predecessor_closer) {
      upper_store.assign(numerator);
      upper_store <<= 1;
      upper = &upper_store;
    }
    numerator *= value.f;
    numerator <<= shift;
    denominator = 1;
    denominator <<= shift - value.e;
  } else {
    numerator = value.f;
    numerator <<= shift;
    denominator.assign_pow10(exp10);
    denominator <<= shift - value.e;
    lower = 1;
    if (is_predecessor_closer) {
      upper_store = 1ULL << 1;
      upper = &upper_store;
    }
  }
  int even = static_cast<int>((value.f & 1) == 0);
  if (!upper) upper = &lower;
  bool shortest = num_digits < 0;
  if ((flags & dragon::fixup) != 0) {
    if (add_compare(numerator, *upper, denominator) + even <= 0) {
      --exp10;
      numerator *= 10;
      if (num_digits < 0) {
        lower *= 10;
        if (upper != &lower) *upper *= 10;
      }
    }
    if ((flags & dragon::fixed) != 0) adjust_precision(num_digits, exp10 + 1);
  }
  // Invariant: value == (numerator / denominator) * pow(10, exp10).
  if (shortest) {
    // Generate the shortest representation.
    num_digits = 0;
    char* data = buf.data();
    for (;;) {
      int digit = numerator.divmod_assign(denominator);
      bool low = compare(numerator, lower) - even < 0;  // numerator <[=] lower.
      // numerator + upper >[=] pow10:
      bool high = add_compare(numerator, *upper, denominator) + even > 0;
      data[num_digits++] = static_cast<char>('0' + digit);
      if (low || high) {
        if (!low) {
          ++data[num_digits - 1];
        } else if (high) {
          int result = add_compare(numerator, numerator, denominator);
          // Round half to even.
          if (result > 0 || (result == 0 && (digit % 2) != 0))
            ++data[num_digits - 1];
        }
        buf.try_resize(to_unsigned(num_digits));
        exp10 -= num_digits - 1;
        return;
      }
      numerator *= 10;
      lower *= 10;
      if (upper != &lower) *upper *= 10;
    }
  }
  // Generate the given number of digits.
  exp10 -= num_digits - 1;
  if (num_digits <= 0) {
    denominator *= 10;
    auto digit = add_compare(numerator, numerator, denominator) > 0 ? '1' : '0';
    buf.push_back(digit);
    return;
  }
  buf.try_resize(to_unsigned(num_digits));
  for (int i = 0; i < num_digits - 1; ++i) {
    int digit = numerator.divmod_assign(denominator);
    buf[i] = static_cast<char>('0' + digit);
    numerator *= 10;
  }
  int digit = numerator.divmod_assign(denominator);
  auto result = add_compare(numerator, numerator, denominator);
  if (result > 0 || (result == 0 && (digit % 2) != 0)) {
    if (digit == 9) {
      const auto overflow = '0' + 10;
      buf[num_digits - 1] = overflow;
      // Propagate the carry.
      for (int i = num_digits - 1; i > 0 && buf[i] == overflow; --i) {
        buf[i] = '0';
        ++buf[i - 1];
      }
      if (buf[0] == overflow) {
        buf[0] = '1';
        if ((flags & dragon::fixed) != 0) buf.push_back('0');
        else ++exp10;
      }
      return;
    }
    ++digit;
  }
  buf[num_digits - 1] = static_cast<char>('0' + digit);
}